

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_7a016f::HandleConcatCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  cmExecutionStatus *this;
  cmExecutionStatus *args_00;
  size_type sVar1;
  cmMakefile *makefile;
  string local_78;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  args_00 = status_local;
  this = local_20;
  if (sVar1 < 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"sub-command CONCAT requires at least one argument.",&local_41);
    cmExecutionStatus::SetError(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    args_local._7_1_ = 0;
  }
  else {
    std::__cxx11::string::string((string *)&local_78);
    makefile = cmExecutionStatus::GetMakefile(local_20);
    args_local._7_1_ =
         joinImpl((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)args_00,&local_78,1,makefile);
    std::__cxx11::string::~string((string *)&local_78);
  }
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool HandleConcatCommand(std::vector<std::string> const& args,
                         cmExecutionStatus& status)
{
  if (args.size() < 2) {
    status.SetError("sub-command CONCAT requires at least one argument.");
    return false;
  }

  return joinImpl(args, std::string(), 1, status.GetMakefile());
}